

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLEntityDecl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLEntityDecl::XMLEntityDecl
          (XMLEntityDecl *this,XMLCh *entName,XMLCh value,MemoryManager *manager)

{
  XMLCh *pXVar1;
  CleanupType_conflict10 cleanup;
  XMLCh dummy [2];
  JanitorMemFunCall<xercesc_4_0::XMLEntityDecl> local_30;
  uint local_14;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLEntityDecl_004010c8;
  this->fId = 0;
  this->fValueLen = 1;
  this->fValue = (XMLCh *)0x0;
  this->fName = (XMLCh *)0x0;
  this->fNotationName = (XMLCh *)0x0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fBaseURI = (XMLCh *)0x0;
  this->fIsExternal = false;
  this->fMemoryManager = manager;
  local_30.fToCall = (MFPT)cleanUp;
  local_30._16_8_ = 0;
  local_14 = (uint)(ushort)value;
  local_30.fObject = this;
  pXVar1 = XMLString::replicate((XMLCh *)&local_14,manager);
  this->fValue = pXVar1;
  pXVar1 = XMLString::replicate(entName,this->fMemoryManager);
  this->fName = pXVar1;
  local_30.fObject = (XMLEntityDecl *)0x0;
  JanitorMemFunCall<xercesc_4_0::XMLEntityDecl>::~JanitorMemFunCall(&local_30);
  return;
}

Assistant:

XMLEntityDecl::XMLEntityDecl(const  XMLCh* const   entName
                            , const XMLCh          value
                            , MemoryManager* const manager) :
    fId(0)
    , fValueLen(1)
    , fValue(0)
    , fName(0)
    , fNotationName(0)
    , fPublicId(0)
    , fSystemId(0)
    , fBaseURI(0)
    , fIsExternal(false)
    , fMemoryManager(manager)
{
    CleanupType cleanup(this, &XMLEntityDecl::cleanUp);

    try
    {
        XMLCh dummy[2] = { chNull, chNull };
        dummy[0] = value;
        fValue = XMLString::replicate(dummy, fMemoryManager);
        fName = XMLString::replicate(entName, fMemoryManager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}